

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

string * __thiscall
Json::Value::getComment_abi_cxx11_
          (string *__return_storage_ptr__,Value *this,CommentPlacement placement)

{
  CommentInfo *pCVar1;
  allocator local_9;
  
  pCVar1 = this->comments_;
  if ((pCVar1 == (CommentInfo *)0x0) || (pCVar1[placement].comment_ == (char *)0x0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pCVar1[placement].comment_,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Value::getComment(CommentPlacement placement) const {
  if (hasComment(placement))
    return comments_[placement].comment_;
  return "";
}